

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monitor.c
# Opt level: O0

void monitor(void)

{
  uint uVar1;
  int iVar2;
  uint local_e;
  ushort local_c;
  uint d;
  uint c;
  uint init_colour;
  
  local_c = 0;
  uVar1 = getcolor();
  setpalette('\v','\b');
  setpalette('\f','\a');
  setpalette('\r','\0');
  setpalette('\x0e','\x03');
  setpalette('\x0f','\x04');
  setbkcolor(0xc);
  cleardevice();
  settextstyle(0,0,3);
  setcolor(0xf);
  outtextxy(10,10,"Options");
  setcolor(0xb);
  outtextxy(0xc,0xc,"Options");
  setcolor(0xe);
  outtextxy(0xe,0xe,"Options");
  setcolor(0xd);
  settextstyle(0,0,1);
  outtextxy(0,0x3c,"X : Quit Softbeeb");
  outtextxy(0,0x46,"B : Simulate Break Key (Reset)");
  outtextxy(0,0x50,"R : Redraw Graphics Screen");
  outtextxy(0,0x5a,"S : PC Speaker Sound Emulation");
  outtextxy(0,0x6e,"Press the key of your choice");
  outtextxy(0x32,200," Press `return\' to continue the Emulation");
  while (iVar2 = kbhit(), iVar2 != 0) {
    coniogetch();
  }
  while (local_c != 0xd) {
    iVar2 = tolower((uint)local_c);
    switch(iVar2) {
    case 0x62:
      setcolor(0xf);
      outtextxy(0,0x131,"Press Y to confirm reset");
      iVar2 = coniogetch();
      iVar2 = tolower(iVar2);
      if (iVar2 == 0x79) {
        pc = 0xd9cd;
      }
      setcolor(0xc);
      outtextxy(0,0x131,"Press Y to confirm reset");
      setcolor(0xd);
      break;
    case 0x72:
      if (teletext == '\0') {
        setcolor(0xf);
        outtextxy(0,0x131,"Redrawing Graphics Screen...");
        local_e = screen_start;
        setactivepage(0);
        for (local_c = 0; (int)(uint)local_c < (int)(0x8000 - (uint)ram_screen_start);
            local_c = local_c + 1) {
          if (local_e == 0x8000) {
            local_e = ram_screen_start;
          }
          (*screen_byte_P)(RAM[local_e],local_e);
          local_e = local_e + 1;
          update_cursor();
        }
        setactivepage(1);
      }
      setcolor(0xc);
      outtextxy(0,0x131,"Redrawing Graphics Screen...");
      setcolor(0xd);
      break;
    case 0x73:
      setcolor(0xf);
      outtextxy(0,0x131,"Do you want sound? Y/N");
      iVar2 = coniogetch();
      iVar2 = tolower(iVar2);
      if (iVar2 == 0x79) {
        soundyesno = '\x01';
        update_sound();
      }
      else {
        soundyesno = '\0';
        nosound();
      }
      setcolor(0xc);
      outtextxy(0,0x131,"Do you want sound? Y/N");
      setcolor(0xd);
      break;
    case 0x78:
      setcolor(0xf);
      outtextxy(0,0x131,"Are you sure you want to quit? Y/N");
      iVar2 = coniogetch();
      iVar2 = tolower(iVar2);
      if (iVar2 == 0x79) {
        quit_prog();
      }
      else {
        setcolor(0xc);
        outtextxy(0,0x131,"Are you sure you want to quit? Y/N");
      }
      setcolor(0xd);
    }
    iVar2 = coniogetch();
    local_c = (ushort)iVar2;
  }
  setbkcolor(0);
  setcolor((uint)uVar1);
  return;
}

Assistant:

void monitor(void) {
    uint init_colour;
    uint c = 0;  // misc counters
    uint d = 0;  // misc counters

    init_colour = getcolor();

    setpalette(11, EGA_LIGHTRED);
    setpalette(12, EGA_BLACK);
    setpalette(13, EGA_WHITE);
    setpalette(14, EGA_BLUE);
    setpalette(15, EGA_YELLOW);
    setbkcolor(BLACK);
    cleardevice();

    settextstyle(DEFAULT_FONT, HORIZ_DIR, 3);
    setcolor(YELLOW);
    outtextxy(10, 10, "Options");
    setcolor(RED);
    outtextxy(12, 12, "Options");
    setcolor(BLUE);
    outtextxy(14, 14, "Options");

    setcolor(WHITE);

    settextstyle(DEFAULT_FONT, HORIZ_DIR, 1);

/* The area 0,300,0,350 is to be left clear for further option prompts */

/*****************************************
******************************************
*****************************************/

    outtextxy(0, 60, "X : Quit Softbeeb");
    outtextxy(0, 70, "B : Simulate Break Key (Reset)");
    outtextxy(0, 80, "R : Redraw Graphics Screen");
    outtextxy(0, 90, "S : PC Speaker Sound Emulation");
    outtextxy(0, 110, "Press the key of your choice");
    outtextxy(50, 200, " Press `return' to continue the Emulation");

    while (kbhit()) coniogetch();

    for (; c != '\r'; c = coniogetch()) {
        switch (tolower(c)) {

            case 'x':
                setcolor(YELLOW);
                outtextxy(0, 305, "Are you sure you want to quit? Y/N");
                if (tolower(coniogetch()) == 'y') quit_prog();
                else {
                    setcolor(BLACK);
                    outtextxy(0, 305, "Are you sure you want to quit? Y/N");
                }
                setcolor(WHITE);
                break;
            case 'r':
                if (!teletext) {
                    setcolor(YELLOW);
                    outtextxy(0, 305, "Redrawing Graphics Screen...");
                    d = screen_start;
                    setactivepage(0);
                    for (c = 0; c < (0x8000 - ram_screen_start); c++) {
                        if (d == 0x8000) d = ram_screen_start;
                        screen_byte_P(RAM[d], d);
                        d++;
                        update_cursor();
                    }
                    setactivepage(1);
                }
                setcolor(BLACK);
                outtextxy(0, 305, "Redrawing Graphics Screen...");
                setcolor(WHITE);
                break;
            case 'b':
                setcolor(YELLOW);
                outtextxy(0, 305, "Press Y to confirm reset");
                if (tolower(coniogetch()) == 'y')
                    pc = 0xD9CD;
                setcolor(BLACK);
                outtextxy(0, 305, "Press Y to confirm reset");
                setcolor(WHITE);
                break;

            case 's':
                setcolor(YELLOW);
                outtextxy(0, 305, "Do you want sound? Y/N");
                if (tolower(coniogetch()) == 'y') {
                    soundyesno = 1;
                    update_sound();
                }
                else {
                    soundyesno = 0;
                    nosound();
                }
                setcolor(BLACK);
                outtextxy(0, 305, "Do you want sound? Y/N");
                setcolor(WHITE);
                break;


        }


    }
    setbkcolor(0);
    setcolor(init_colour);
}